

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.c
# Opt level: O3

ecs_snapshot_t * ecs_snapshot_take_w_iter(ecs_iter_t *iter,ecs_iter_next_action_t next)

{
  ecs_world_t *world;
  ecs_snapshot_t *peVar1;
  
  world = iter->world;
  _ecs_assert(world != (ecs_world_t *)0x0,0xc,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/snapshot.c"
              ,0x9c);
  if (world != (ecs_world_t *)0x0) {
    peVar1 = snapshot_create(world,(world->store).entity_index,iter,next);
    peVar1->last_id = (world->stats).last_id;
    return peVar1;
  }
  __assert_fail("world != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/addons/snapshot.c"
                ,0x9c,
                "ecs_snapshot_t *ecs_snapshot_take_w_iter(ecs_iter_t *, ecs_iter_next_action_t)");
}

Assistant:

ecs_snapshot_t* ecs_snapshot_take_w_iter(
    ecs_iter_t *iter,
    ecs_iter_next_action_t next)
{
    ecs_world_t *world = iter->world;
    ecs_assert(world != NULL, ECS_INTERNAL_ERROR, NULL);

    ecs_snapshot_t *result = snapshot_create(
        world,
        world->store.entity_index,
        iter,
        next);

    result->last_id = world->stats.last_id;

    return result;
}